

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O0

bool __thiscall ctemplate::UnclosedSnippetTags::MaybeRemove(UnclosedSnippetTags *this,Tag tag)

{
  char *local_30;
  char *c;
  char *tag_location;
  Tag tag_local;
  UnclosedSnippetTags *this_local;
  
  local_30 = strchr(this->tags,tag);
  if (local_30 == (char *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    for (; *local_30 != '\0'; local_30 = local_30 + 1) {
      *local_30 = local_30[1];
    }
    this->tag_length = this->tag_length + -1;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

inline bool MaybeRemove(Tag tag) {
    char* tag_location = strchr(tags, tag);
    if (tag_location) {
      for (char* c = tag_location; *c; ++c) {
        // Have to copy all later tags down by one so we don't leave a gap in the
        // array.
        *c = *(c + 1);
      }
      --tag_length;
      return true;
    } else {
      return false;
    }
  }